

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikey(fitsfile *fptr,char *card,int *status)

{
  long lVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  int *in_RDX;
  char *in_RSI;
  int *in_RDI;
  char buff2 [81];
  char buff1 [81];
  char *tmpbuff;
  char *outbuff;
  char *inbuff;
  LONGLONG bytepos;
  long nblocks;
  int keylength;
  int nshift;
  int len;
  int ii;
  int *in_stack_00001610;
  int in_stack_0000161c;
  long in_stack_00001620;
  fitsfile *in_stack_00001628;
  size_t in_stack_fffffffffffffee8;
  int *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  LONGLONG in_stack_ffffffffffffff00;
  fitsfile *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff30;
  undefined1 uVar5;
  undefined7 in_stack_ffffffffffffff39;
  int *in_stack_ffffffffffffff40;
  fitsfile *in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  fitsfile *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  fitsfile *in_stack_ffffffffffffff68;
  int local_30;
  int local_24;
  int local_4;
  
  if (*in_RDX < 1) {
    if (*in_RDI != *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
      ffmahd(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             &in_stack_ffffffffffffff58->HDUposition,in_stack_ffffffffffffff50);
    }
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) - *(long *)(*(long *)(in_RDI + 2) + 0x70) == 0x50)
       && (iVar3 = ffiblk(in_stack_00001628,in_stack_00001620,in_stack_0000161c,in_stack_00001610),
          0 < iVar3)) {
      local_4 = *in_RDX;
    }
    else {
      lVar1 = *(long *)(*(long *)(in_RDI + 2) + 0x70);
      lVar2 = *(long *)(*(long *)(in_RDI + 2) + 0x80);
      strncpy(&stack0xfffffffffffffee8,in_RSI,0x50);
      uVar5 = 0;
      sVar4 = strlen(&stack0xfffffffffffffee8);
      for (local_24 = 0; iVar3 = (int)sVar4, local_24 < (int)sVar4; local_24 = local_24 + 1) {
        if (((char)(&stack0xfffffffffffffee8)[local_24] < ' ') ||
           ('~' < (char)(&stack0xfffffffffffffee8)[local_24])) {
          (&stack0xfffffffffffffee8)[local_24] = 0x20;
        }
      }
      while (local_24 = iVar3, local_24 < 0x50) {
        (&stack0xfffffffffffffee8)[local_24] = 0x20;
        iVar3 = local_24 + 1;
      }
      sVar4 = strcspn(&stack0xfffffffffffffee8,"=");
      local_30 = (int)sVar4;
      if (local_30 == 0x50) {
        local_30 = 8;
      }
      iVar3 = fits_strncasecmp((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                               ,(char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if ((((iVar3 == 0) ||
           (iVar3 = fits_strncasecmp((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8),
                                     (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
           iVar3 == 0)) ||
          (iVar3 = fits_strncasecmp((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                     in_stack_fffffffffffffef8),
                                    (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
          iVar3 == 0)) ||
         (iVar3 = fits_strncasecmp((char *)CONCAT44(in_stack_fffffffffffffefc,
                                                    in_stack_fffffffffffffef8),
                                   (char *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8),
         iVar3 == 0)) {
        local_30 = 8;
      }
      for (local_24 = 0; local_24 < local_30; local_24 = local_24 + 1) {
        iVar3 = toupper((int)(char)(&stack0xfffffffffffffee8)[local_24]);
        (&stack0xfffffffffffffee8)[local_24] = (char)iVar3;
      }
      fftkey((char *)in_stack_ffffffffffffff68,
             (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      ffmbyt(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             in_stack_fffffffffffffef0);
      for (local_24 = 0; local_24 < (int)((lVar1 - lVar2) / 0x50); local_24 = local_24 + 1) {
        ffgbyt(in_stack_ffffffffffffff48,(LONGLONG)in_stack_ffffffffffffff40,
               (void *)CONCAT71(in_stack_ffffffffffffff39,uVar5),in_stack_ffffffffffffff30);
        ffmbyt(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               in_stack_fffffffffffffef0);
        ffpbyt(in_stack_ffffffffffffff58,(LONGLONG)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      }
      ffpbyt(in_stack_ffffffffffffff58,(LONGLONG)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48
             ,in_stack_ffffffffffffff40);
      *(long *)(*(long *)(in_RDI + 2) + 0x70) = *(long *)(*(long *)(in_RDI + 2) + 0x70) + 0x50;
      *(long *)(*(long *)(in_RDI + 2) + 0x80) = *(long *)(*(long *)(in_RDI + 2) + 0x80) + 0x50;
      local_4 = *in_RDX;
    }
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffikey(fitsfile *fptr,    /* I - FITS file pointer  */
           const char *card,  /* I - card string value  */
           int *status)       /* IO - error status      */
/*
  insert a keyword at the position of (fptr->Fptr)->nextkey
*/
{
    int ii, len, nshift, keylength;
    long nblocks;
    LONGLONG bytepos;
    char *inbuff, *outbuff, *tmpbuff, buff1[FLEN_CARD], buff2[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if ( ((fptr->Fptr)->datastart - (fptr->Fptr)->headend) == 80) /* only room for END card */
    {
        nblocks = 1;
        if (ffiblk(fptr, nblocks, 0, status) > 0) /* add new 2880-byte block*/
            return(*status);  
    }

    /* no. keywords to shift */
    nshift= (int) (( (fptr->Fptr)->headend - (fptr->Fptr)->nextkey ) / 80); 

    strncpy(buff2, card, 80);     /* copy card to output buffer */
    buff2[80] = '\0';

    len = strlen(buff2);

    /* silently replace any illegal characters with a space */
    for (ii=0; ii < len; ii++)   
        if (buff2[ii] < ' ' || buff2[ii] > 126) buff2[ii] = ' ';

    for (ii=len; ii < 80; ii++)   /* fill buffer with spaces if necessary */
        buff2[ii] = ' ';

    keylength = strcspn(buff2, "=");
    if (keylength == 80) keylength = 8;
    
    /* test for the common commentary keywords which by definition have 8-char names */
    if ( !fits_strncasecmp( "COMMENT ", buff2, 8) || !fits_strncasecmp( "HISTORY ", buff2, 8) ||
         !fits_strncasecmp( "        ", buff2, 8) || !fits_strncasecmp( "CONTINUE", buff2, 8) )
	 keylength = 8;

    for (ii=0; ii < keylength; ii++)       /* make sure keyword name is uppercase */
        buff2[ii] = toupper(buff2[ii]);

    fftkey(buff2, status);        /* test keyword name contains legal chars */

/*  no need to do this any more, since any illegal characters have been removed
    fftrec(buff2, status);  */      /* test rest of keyword for legal chars   */

    inbuff = buff1;
    outbuff = buff2;

    bytepos = (fptr->Fptr)->nextkey;           /* pointer to next keyword in header */
    ffmbyt(fptr, bytepos, REPORT_EOF, status);

    for (ii = 0; ii < nshift; ii++) /* shift each keyword down one position */
    {
        ffgbyt(fptr, 80, inbuff, status);   /* read the current keyword */

        ffmbyt(fptr, bytepos, REPORT_EOF, status); /* move back */
        ffpbyt(fptr, 80, outbuff, status);  /* overwrite with other buffer */

        tmpbuff = inbuff;   /* swap input and output buffers */
        inbuff = outbuff;
        outbuff = tmpbuff;

        bytepos += 80;
    }

    ffpbyt(fptr, 80, outbuff, status);  /* write the final keyword */

    (fptr->Fptr)->headend += 80; /* increment the position of the END keyword */
    (fptr->Fptr)->nextkey += 80; /* increment the pointer to next keyword */

    return(*status);
}